

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField(ExtensionSet *this,int number)

{
  iterator iVar1;
  LogMessage *pLVar2;
  LogFinisher local_4d;
  int number_local;
  LogMessage local_48;
  
  number_local = number;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                  *)this,&number_local);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->extensions_)._M_t._M_impl.super__Rb_tree_header) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x137);
    pLVar2 = LogMessage::operator<<(&local_48,"CHECK failed: iter != extensions_.end(): ");
    pLVar2 = LogMessage::operator<<(pLVar2,"no extension numbered ");
    pLVar2 = LogMessage::operator<<(pLVar2,number_local);
    LogFinisher::operator=(&local_4d,pLVar2);
    LogMessage::~LogMessage(&local_48);
  }
  return iVar1._M_node[1]._M_parent;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number) {
  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  map<int, Extension>::const_iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "no extension numbered " << number;
  return iter->second.repeated_int32_value;
}